

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_report(feat_t *f)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  err_msg(ERR_INFO,(char *)0x0,0,"Initialization of feat_t, report:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Feature type         = %s\n",f->name);
  err_msg(ERR_INFO,(char *)0x0,0,"Cepstral size        = %d\n",(ulong)(uint)f->cepsize);
  err_msg(ERR_INFO,(char *)0x0,0,"Number of streams    = %d\n",(ulong)(uint)f->n_stream);
  if (0 < f->n_stream) {
    uVar3 = 0;
    do {
      err_msg(ERR_INFO,(char *)0x0,0,"Vector size of stream[%d]: %d\n",uVar3 & 0xffffffff,
              (ulong)f->stream_len[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)f->n_stream);
  }
  err_msg(ERR_INFO,(char *)0x0,0,"Number of subvectors = %d\n",(ulong)(uint)f->n_sv);
  if (0 < f->n_sv) {
    uVar3 = 0;
    do {
      err_msg(ERR_INFO,(char *)0x0,0,"Components of subvector[%d]:",uVar3 & 0xffffffff);
      piVar2 = f->subvecs[uVar3];
      if (piVar2 != (int *)0x0) {
        iVar1 = *piVar2;
        while (iVar1 != -1) {
          piVar2 = piVar2 + 1;
          err_msg(ERR_INFOCONT,(char *)0x0,0," %d");
          iVar1 = *piVar2;
        }
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)f->n_sv);
  }
  err_msg(ERR_INFO,(char *)0x0,0,"Whether CMN is used  = %d\n",(ulong)f->cmn);
  err_msg(ERR_INFO,(char *)0x0,0,"Whether AGC is used  = %d\n",(ulong)f->agc);
  err_msg(ERR_INFO,(char *)0x0,0,"Whether variance is normalized = %d\n",(ulong)(uint)f->varnorm);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

void
feat_report(feat_t * f)
{
    int i;
    E_INFO_NOFN("Initialization of feat_t, report:\n");
    E_INFO_NOFN("Feature type         = %s\n", f->name);
    E_INFO_NOFN("Cepstral size        = %d\n", f->cepsize);
    E_INFO_NOFN("Number of streams    = %d\n", f->n_stream);
    for (i = 0; i < f->n_stream; i++) {
        E_INFO_NOFN("Vector size of stream[%d]: %d\n", i,
                    f->stream_len[i]);
    }
    E_INFO_NOFN("Number of subvectors = %d\n", f->n_sv);
    for (i = 0; i < f->n_sv; i++) {
        int32 *sv;

        E_INFO_NOFN("Components of subvector[%d]:", i);
        for (sv = f->subvecs[i]; sv && *sv != -1; ++sv)
            E_INFOCONT(" %d", *sv);
        E_INFOCONT("\n");
    }
    E_INFO_NOFN("Whether CMN is used  = %d\n", f->cmn);
    E_INFO_NOFN("Whether AGC is used  = %d\n", f->agc);
    E_INFO_NOFN("Whether variance is normalized = %d\n", f->varnorm);
    E_INFO_NOFN("\n");
}